

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

double __thiscall
imrt::EvaluationFunction::incremental_eval
          (EvaluationFunction *this,Station *station,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  pair<int,_int> *ppVar1;
  bool bVar2;
  reference pvVar3;
  reference ppVar4;
  reference pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  undefined8 in_R9;
  double dVar7;
  double dVar8;
  __type_conflict _Var9;
  double prev_Dok;
  double pen;
  int b;
  pair<int,_double> let;
  iterator __end3;
  iterator __begin3;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range3;
  double delta;
  int k;
  Matrix *Dep;
  int o;
  double delta_F;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffe78;
  int __y;
  pair<int,_int> *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  Station *in_stack_fffffffffffffe90;
  double in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *Zmax_00;
  undefined4 in_stack_ffffffffffffff40;
  int iVar10;
  pair<int,_int> in_stack_ffffffffffffff50;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_90;
  int local_80;
  _Self local_70;
  _Self local_68;
  undefined8 local_60;
  pair<int,_int> *local_58;
  int local_4c;
  Matrix *local_48;
  int local_3c;
  double local_38;
  undefined8 local_30;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  
  in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::clear((list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
           *)in_stack_fffffffffffffe80);
  local_38 = 0.0;
  local_3c = 0;
  do {
    if (*(int *)&in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start <= local_3c) {
      in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)(local_38 +
                           (double)in_RDI[4].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish);
      n_evaluations = n_evaluations + 1;
      return (double)in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    }
    local_48 = Station::getDepositionMatrix
                         (in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20))
    ;
    local_4c = 0;
    while (iVar10 = local_4c,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(long)local_3c), iVar10 < *pvVar3)
    {
      local_58 = (pair<int,_int> *)0x0;
      local_60 = local_30;
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
           begin(in_stack_fffffffffffffe78);
      local_70._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                     (in_stack_fffffffffffffe78);
      while (bVar2 = std::operator!=(&local_68,&local_70), bVar2) {
        ppVar4 = std::_List_iterator<std::pair<int,_double>_>::operator*
                           ((_List_iterator<std::pair<int,_double>_> *)in_stack_fffffffffffffe80);
        dVar8 = ppVar4->second;
        local_80 = (int)*(undefined8 *)ppVar4;
        dVar7 = maths::Matrix::operator()(local_48,local_4c,local_80);
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          dVar7 = maths::Matrix::operator()(local_48,local_4c,local_80);
          local_58 = (pair<int,_int> *)(dVar7 * dVar8 + (double)local_58);
        }
        std::_List_iterator<std::pair<int,_double>_>::operator++(&local_68);
      }
      if (((double)local_58 != 0.0) || (NAN((double)local_58))) {
        local_90 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x0;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c);
        __y = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
        Zmax_00 = (vector<double,_std::allocator<double>_> *)*pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_3c);
        if (*pvVar6 <= (double)Zmax_00) {
LAB_0012359a:
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c
                               );
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
          dVar8 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_3c)
          ;
          if (*pvVar6 <= dVar8) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)local_3c);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c)
            ;
            dVar8 = *pvVar6 + (double)local_58;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_20,(long)local_3c);
            if (dVar8 < *pvVar6) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (local_18,(long)local_3c);
              dVar8 = *pvVar6;
              std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_3c);
              pvVar5 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (long)local_3c);
              std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
              _Var9 = std::pow<double,int>((double)in_stack_fffffffffffffe80,__y);
              local_90 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         (dVar8 * _Var9 + 0.0);
            }
          }
          else {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_3c);
            dVar8 = *pvVar6;
            std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_3c);
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)local_3c);
            std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
            _Var9 = std::pow<double,int>((double)in_stack_fffffffffffffe80,__y);
            local_90 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (-dVar8 * _Var9 + 0.0);
          }
        }
        else {
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c
                               );
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
          in_stack_ffffffffffffff30 = *pvVar6 + (double)local_58;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_3c)
          ;
          if (*pvVar6 <= in_stack_ffffffffffffff30) goto LAB_0012359a;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_3c)
          ;
          ppVar1 = local_58;
          dVar7 = *pvVar6 * (double)local_58;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c
                               );
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
          dVar8 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_3c)
          ;
          local_90 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     (dVar7 * ((dVar8 - *pvVar6) + (dVar8 - *pvVar6) + (double)ppVar1) + 0.0);
        }
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
        dVar8 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_3c);
        if (dVar8 < *pvVar6 || dVar8 == *pvVar6) {
LAB_00123968:
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c
                               );
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
          dVar8 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_3c)
          ;
          if (dVar8 < *pvVar6 || dVar8 == *pvVar6) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)local_3c);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c)
            ;
            dVar8 = *pvVar6 + (double)local_58;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_28,(long)local_3c);
            if (*pvVar6 <= dVar8 && dVar8 != *pvVar6) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (local_18,(long)local_3c);
              dVar8 = *pvVar6;
              pvVar5 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (long)local_3c);
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar5,(long)local_4c);
              in_stack_fffffffffffffe90 = (Station *)(*pvVar6 + (double)local_58);
              std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_3c);
              _Var9 = std::pow<double,int>((double)in_stack_fffffffffffffe80,__y);
              local_90 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         (dVar8 * _Var9 + (double)local_90);
            }
          }
          else {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_3c);
            dVar8 = *pvVar6;
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)local_3c);
            std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
            std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_3c);
            _Var9 = std::pow<double,int>((double)in_stack_fffffffffffffe80,__y);
            local_90 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (-dVar8 * _Var9 + (double)local_90);
          }
        }
        else {
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c
                               );
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
          dVar8 = *pvVar6 + (double)local_58;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_3c)
          ;
          if (dVar8 < *pvVar6 || dVar8 == *pvVar6) goto LAB_00123968;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_3c)
          ;
          ppVar1 = local_58;
          dVar7 = *pvVar6 * (double)local_58;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_3c)
          ;
          dVar8 = *pvVar6;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c
                               );
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
          local_90 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     (dVar7 * (-dVar8 + *pvVar6 + -dVar8 + *pvVar6 + (double)ppVar1) +
                     (double)local_90);
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(long)local_3c);
        local_38 = (double)local_90 / (double)*pvVar3 + local_38;
        in_stack_fffffffffffffe80 = local_58;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
        *pvVar6 = (double)in_stack_fffffffffffffe80 + *pvVar6;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0xe),(long)local_3c);
        std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_4c);
        update_sorted_voxels
                  ((EvaluationFunction *)in_stack_ffffffffffffff50,in_RDI,
                   (vector<double,_std::allocator<double>_> *)
                   CONCAT44(iVar10,in_stack_ffffffffffffff40),Zmax_00,
                   (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                   SUB84(in_stack_ffffffffffffff30,0));
        in_stack_fffffffffffffe88 = (value_type *)(in_RDI + 0xf);
        in_stack_ffffffffffffff50 = std::make_pair<int&,int&>((int *)local_90,(int *)0x123ca8);
        std::make_pair<std::pair<int,int>,double&>(in_stack_fffffffffffffe80,(double *)local_90);
        std::__cxx11::
        list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
        ::push_back((list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                     *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        in_stack_fffffffffffffe78 = local_90;
      }
      local_4c = local_4c + 1;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

double EvaluationFunction::incremental_eval(Station& station, vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax, list< pair< int, double > >& diff){

  prev_F=F; Z_diff.clear();
  double delta_F=0.0;

  //for each voxel we compute the change produced by the modified beamlets
  //while at the same time we compute the variation in the function F produced by all these changes

  for(int o=0; o<nb_organs; o++){
		const Matrix&  Dep = station.getDepositionMatrix(o);
		for(int k=0; k<nb_voxels[o]; k++){

		//we compute the change in the delivered dose in voxel k of the organ o
		double delta=0.0;

		//cout << station.changed_lets.size() << endl;
		for (auto let:diff){
		    int b=let.first;
			  if(Dep(k,b)==0.0) continue;
				delta+= Dep(k,b)*let.second;
		}


		if(delta==0.0) continue; //no change in the voxel


		double pen=0.0;
		//with the change in the dose of a voxel we can incrementally modify the value of F
		if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
			pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
		else if(Z[o][k] < Zmin[o]) //the penalty disappears
			pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
		else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
			pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );

		if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
			pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
		else if(Z[o][k] > Zmax[o]) //the penalty disappears
			pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
		else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
			pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );

		delta_F += pen/nb_voxels[o];
		Z[o][k] += delta;

    double prev_Dok=D[o][k];
		update_sorted_voxels(w, Zmin, Zmax, o, k);
		//update_beamlets_impact(o, k, prev_Dok);

		//we save the last changes (see undo_last_eval)
		Z_diff.push_back(make_pair(make_pair(o,k),delta));
	}
  }

  F+=delta_F;
  n_evaluations++;
  return F;

}